

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Type *pTVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar6;
  ShapeRange *pSVar7;
  PoolingLayerParams *this_02;
  uint64 uVar8;
  runtime_error *this_03;
  PoolingLayerParams_ValidCompletePadding *pPVar9;
  size_t sVar10;
  size_t sVar11;
  ValidPadding *pVVar12;
  BorderAmounts *pBVar13;
  Type *pTVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int val;
  uint uVar19;
  int local_dc;
  ShapeRange local_b0;
  ShapeRange local_90;
  ShapeRange local_70;
  ShapeRange local_50;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar5);
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar5);
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar5);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  pSVar7 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect(&local_90,pSVar6,pSVar7);
  ShapeConstraint::updateSequenceRange(this_01,&local_90);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  pSVar7 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect(&local_90,pSVar6,pSVar7);
  ShapeConstraint::updateBatchRange(this_01,&local_90);
  pSVar6 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar6);
  this_02 = Specification::NeuralNetworkLayer::pooling(specLayer);
  if ((this_02->kernelsize_).current_size_ == 0) {
    iVar2 = 3;
    iVar16 = 3;
  }
  else {
    uVar8 = Specification::PoolingLayerParams::kernelsize(this_02,0);
    iVar16 = (int)uVar8;
    uVar8 = Specification::PoolingLayerParams::kernelsize(this_02,1);
    iVar2 = (int)uVar8;
  }
  if ((this_02->stride_).current_size_ == 0) {
    iVar4 = 1;
    iVar3 = 1;
  }
  else {
    uVar8 = Specification::PoolingLayerParams::stride(this_02,0);
    iVar3 = (int)uVar8;
    uVar8 = Specification::PoolingLayerParams::stride(this_02,1);
    iVar4 = (int)uVar8;
  }
  if (this_02->globalpooling_ == true) {
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
  }
  else {
    uVar1 = this_02->_oneof_case_[0];
    if (uVar1 == 0x1e) {
      pVVar12 = Specification::PoolingLayerParams::valid(this_02);
      pBVar13 = pVVar12->paddingamounts_;
      if (pBVar13 == (BorderAmounts *)0x0) {
        pBVar13 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
      }
      if ((pBVar13->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        local_dc = 0;
        iVar17 = 0;
        iVar18 = 0;
      }
      else {
        pVVar12 = Specification::PoolingLayerParams::valid(this_02);
        pBVar13 = pVVar12->paddingamounts_;
        if (pBVar13 == (BorderAmounts *)0x0) {
          pBVar13 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                            (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,0);
        uVar8 = pTVar14->startedgesize_;
        pVVar12 = Specification::PoolingLayerParams::valid(this_02);
        pBVar13 = pVVar12->paddingamounts_;
        if (pBVar13 == (BorderAmounts *)0x0) {
          pBVar13 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                            (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,0);
        iVar18 = (int)uVar8 + (int)pTVar14->endedgesize_;
        pVVar12 = Specification::PoolingLayerParams::valid(this_02);
        pBVar13 = pVVar12->paddingamounts_;
        if (pBVar13 == (BorderAmounts *)0x0) {
          pBVar13 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                            (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,1);
        local_dc = (int)pTVar14->startedgesize_;
        pVVar12 = Specification::PoolingLayerParams::valid(this_02);
        pBVar13 = pVVar12->paddingamounts_;
        if (pBVar13 == (BorderAmounts *)0x0) {
          pBVar13 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                            (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,1);
        iVar17 = (int)pTVar14->endedgesize_;
      }
      if (0 < iVar16 - iVar18) {
        pSVar6 = ShapeConstraint::heightRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar6);
        if (sVar10 == 0) {
          lVar15 = 0;
        }
        else {
          pSVar6 = ShapeConstraint::heightRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar6);
          lVar15 = sVar10 - 1;
        }
        ShapeConstraint::lowerBoundHeight(this_00,(ulong)(uint)(iVar16 - iVar18) + lVar15 * iVar3);
      }
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator+(&local_70,pSVar6,iVar18 - iVar16);
      ShapeRange::operator/(&local_b0,&local_70,(long)iVar3);
      ShapeRange::operator+(&local_90,&local_b0,1);
      ShapeConstraint::updateHeightRange(this_01,&local_90);
      uVar19 = iVar2 - (iVar17 + local_dc);
      if (0 < (int)uVar19) {
        pSVar6 = ShapeConstraint::widthRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar6);
        if (sVar10 == 0) {
          lVar15 = 0;
        }
        else {
          pSVar6 = ShapeConstraint::widthRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar6);
          lVar15 = sVar10 - 1;
        }
        ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar19 + lVar15 * iVar4);
      }
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator+(&local_70,pSVar6,(iVar17 + local_dc) - iVar2);
      ShapeRange::operator/(&local_b0,&local_70,(long)iVar4);
    }
    else {
      if (uVar1 != 0x1f) {
        if (uVar1 != 0x20) {
          if (uVar1 != 0) {
            return;
          }
          this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_03,"Pooling padding type not set");
          __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pPVar9 = Specification::PoolingLayerParams::includelastpixel(this_02);
        val = 0;
        iVar18 = 0;
        iVar17 = 0;
        if ((pPVar9->paddingamounts_).current_size_ != 0) {
          pPVar9 = Specification::PoolingLayerParams::includelastpixel(this_02);
          uVar8 = Specification::PoolingLayerParams_ValidCompletePadding::paddingamounts(pPVar9,0);
          iVar17 = (int)uVar8;
          pPVar9 = Specification::PoolingLayerParams::includelastpixel(this_02);
          uVar8 = Specification::PoolingLayerParams_ValidCompletePadding::paddingamounts(pPVar9,1);
          iVar18 = (int)uVar8;
        }
        if (iVar17 != 0 || iVar18 != 0) {
          sVar10 = ShapeConstraint::minimumHeight(this_00);
          sVar11 = ShapeConstraint::minimumHeight(this_00);
          val = -(uint)((int)sVar11 + iVar17 <= (int)sVar10 + ((iVar17 + iVar3) * 2 - iVar16) + -2);
        }
        pSVar6 = ShapeConstraint::heightRange(this_00);
        ShapeRange::operator+(&local_50,pSVar6,-(iVar16 + iVar17 * -2));
        ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar3);
        ShapeRange::operator+(&local_b0,&local_70,1);
        ShapeRange::operator+(&local_90,&local_b0,val);
        ShapeConstraint::updateHeightRange(this_01,&local_90);
        uVar19 = iVar16 + iVar17 * -2;
        if (uVar19 != 0 && iVar17 * 2 <= iVar16) {
          pSVar6 = ShapeConstraint::heightRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar6);
          ShapeConstraint::lowerBoundHeight(this_00,(uVar19 + sVar10) - 1);
        }
        if (iVar17 == 0 && iVar18 == 0) {
          iVar16 = 0;
        }
        else {
          sVar10 = ShapeConstraint::minimumWidth(this_00);
          sVar11 = ShapeConstraint::minimumWidth(this_00);
          iVar16 = -(uint)((int)sVar11 + iVar18 <= (int)sVar10 + ((iVar4 + iVar18) * 2 - iVar2) + -2
                          );
        }
        pSVar6 = ShapeConstraint::widthRange(this_00);
        ShapeRange::operator+(&local_50,pSVar6,-(iVar2 + iVar18 * -2));
        ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar4);
        ShapeRange::operator+(&local_b0,&local_70,1);
        ShapeRange::operator+(&local_90,&local_b0,iVar16);
        ShapeConstraint::updateWidthRange(this_01,&local_90);
        uVar19 = iVar2 + iVar18 * -2;
        if (uVar19 == 0 || SBORROW4(iVar2,iVar18 * 2) != (int)uVar19 < 0) {
          return;
        }
        pSVar6 = ShapeConstraint::widthRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar6);
        ShapeConstraint::lowerBoundHeight(this_00,(uVar19 + sVar10) - 1);
        return;
      }
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      ShapeRange::operator/(&local_b0,&local_70,(long)iVar3);
      ShapeRange::operator+(&local_90,&local_b0,1);
      ShapeConstraint::updateHeightRange(this_01,&local_90);
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      ShapeRange::operator/(&local_b0,&local_70,(long)iVar4);
    }
    ShapeRange::operator+(&local_90,&local_b0,1);
    ShapeConstraint::updateWidthRange(this_01,&local_90);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() != 0){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() != 0){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() != 0){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() != 0){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}